

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void charls::transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
               (quad<unsigned_char> *destination,quad<unsigned_char> *source,size_t pixel_count,
               inverse *transform)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  size_t sVar4;
  uint uVar5;
  
  if (pixel_count != 0) {
    sVar4 = 0;
    do {
      bVar1 = source[sVar4].super_triplet<unsigned_char>.field_1.v2;
      bVar2 = source[sVar4].super_triplet<unsigned_char>.field_2.v3;
      uVar5 = ((uint)source[sVar4].super_triplet<unsigned_char>.field_0.v1 -
              ((uint)bVar2 + (uint)bVar1 >> 2)) + 0x40;
      cVar3 = (char)uVar5;
      destination[sVar4] =
           (quad<unsigned_char>)
           ((uint)source[sVar4].field_0.v4 << 0x18 |
           (uint)(byte)(bVar2 + cVar3 + 0x80) |
           (uVar5 & 0xff) << 8 | (uint)(byte)(bVar1 + cVar3 + 0x80) << 0x10);
      sVar4 = sVar4 + 1;
    } while (pixel_count != sVar4);
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = quad<PixelType>(transform(source[i].v1, source[i].v2, source[i].v3), source[i].v4);
    }
}